

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mip_level::assign
          (mip_level *this,image_u8 *p,pixel_format fmt,orientation_flags_t orient_flags)

{
  bool bVar1;
  uint uVar2;
  component_flags cVar3;
  pixel_format pVar4;
  orientation_flags_t orient_flags_local;
  pixel_format fmt_local;
  image_u8 *p_local;
  mip_level *this_local;
  
  clear(this);
  this->m_pImage = p;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(p);
  this->m_width = uVar2;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(p);
  this->m_height = uVar2;
  this->m_orient_flags = orient_flags;
  if (fmt == PIXEL_FMT_INVALID) {
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale(p);
    if (bVar1) {
      bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(p,3);
      pVar4 = PIXEL_FMT_L8;
      if (bVar1) {
        pVar4 = PIXEL_FMT_A8L8;
      }
      this->m_format = pVar4;
    }
    else {
      bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(p,3);
      pVar4 = PIXEL_FMT_R8G8B8;
      if (bVar1) {
        pVar4 = PIXEL_FMT_A8R8G8B8;
      }
      this->m_format = pVar4;
    }
  }
  else {
    this->m_format = fmt;
  }
  cVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(p);
  this->m_comp_flags = cVar3;
  return;
}

Assistant:

void mip_level::assign(image_u8* p, pixel_format fmt, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(p);

  clear();

  m_pImage = p;

  m_width = p->get_width();
  m_height = p->get_height();
  m_orient_flags = orient_flags;

  if (fmt != PIXEL_FMT_INVALID)
    m_format = fmt;
  else {
    if (p->is_grayscale())
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8L8 : PIXEL_FMT_L8;
    else
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;
  }

  m_comp_flags = p->get_comp_flags();  //pixel_format_helpers::get_component_flags(m_format);
}